

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int paranoid_fclose(FILE *fp)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = fflush((FILE *)fp);
  piVar2 = __errno_location();
  if ((iVar1 != -1) || (*piVar2 == 9)) {
    *piVar2 = 0;
    iVar1 = fileno((FILE *)fp);
    iVar1 = fsync(iVar1);
    if ((iVar1 != -1) || (*piVar2 == 0x16)) {
      iVar1 = fclose((FILE *)fp);
      return iVar1;
    }
  }
  fclose((FILE *)fp);
  return -1;
}

Assistant:

int paranoid_fclose(FILE *fp) {
    if (-1 == fflush(fp) && errno != EBADF) {
	fclose(fp);
	return -1;
    }

    errno = 0;
    if (-1 == fsync(fileno(fp))) {
	if (errno != EINVAL) { // eg pipe
	    fclose(fp);
	    return -1;
	}
    }
    return fclose(fp);
}